

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  char *__src;
  ptrdiff_t _Num_1;
  ulong uVar3;
  ulong uVar4;
  ptrdiff_t _Num;
  size_t sVar5;
  scoped_padder p;
  scoped_padder local_70;
  format_int local_48;
  
  lVar1 = (msg->time).__d.__r;
  uVar4 = (lVar1 / 1000000000) * -1000000 + lVar1 / 1000;
  scoped_padder::scoped_padder(&local_70,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = 0x3f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar2 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar2 = (uVar2 + 1) -
          (uint)(uVar4 < *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                   (ulong)uVar2 * 8));
  if (uVar2 < 6) {
    sVar5 = 6 - (ulong)uVar2;
    uVar3 = (dest->super_buffer<char>).size_ + sVar5;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar3);
    }
    if ((ulong)uVar2 != 6) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar5);
    }
    (dest->super_buffer<char>).size_ = uVar3;
  }
  __src = fmt::v6::format_int::format_decimal(&local_48,uVar4);
  sVar5 = (long)(local_48.buffer_ + 0x15) - (long)__src;
  uVar4 = (dest->super_buffer<char>).size_ + sVar5;
  local_48.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
  }
  if (local_48.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar4;
  scoped_padder::~scoped_padder(&local_70);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }